

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O3

LayoutNode * __thiscall
rengine::AllocationPool<rengine::LayoutNode>::allocate(AllocationPool<rengine::LayoutNode> *this)

{
  Node **ppNVar1;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  **ppvVar2;
  undefined1 *puVar3;
  uint uVar4;
  uint uVar5;
  LayoutNode *pLVar6;
  uint *puVar7;
  
  uVar4 = this->m_nextFree;
  if (this->m_poolSize <= uVar4) {
    __assert_fail("!isExhausted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x3f,
                  "T *rengine::AllocationPool<rengine::LayoutNode>::allocate() [T = rengine::LayoutNode]"
                 );
  }
  pLVar6 = this->m_memory;
  if (pLVar6 == (LayoutNode *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x40,
                  "T *rengine::AllocationPool<rengine::LayoutNode>::allocate() [T = rengine::LayoutNode]"
                 );
  }
  puVar7 = this->m_free;
  if (puVar7 == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x41,
                  "T *rengine::AllocationPool<rengine::LayoutNode>::allocate() [T = rengine::LayoutNode]"
                 );
  }
  if (puVar7[uVar4] < this->m_poolSize) {
    this->m_nextFree = uVar4 + 1;
    uVar4 = puVar7[uVar4];
    pLVar6[uVar4].super_Node.m_prev = (Node *)0x0;
    ppNVar1 = &pLVar6[uVar4].super_Node.m_child;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    ppvVar2 = &pLVar6[uVar4].super_Node.super_SignalEmitter.m_buckets;
    *ppvVar2 = (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                *)0x0;
    ppvVar2[1] = (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                  *)0x0;
    uVar5 = *(uint *)&pLVar6[uVar4].super_Node.field_0x30;
    pLVar6[uVar4].super_Node.super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__Node_00176bb8;
    puVar3 = &pLVar6[uVar4].super_Node.field_0x34;
    *(undefined8 *)puVar3 = 0;
    *(undefined8 *)(puVar3 + 8) = 0;
    *(undefined8 *)&pLVar6[uVar4].field_0x44 = 0;
    *(undefined8 *)(&pLVar6[uVar4].field_0x44 + 8) = 0;
    *(undefined8 *)&pLVar6[uVar4].field_0x54 = 0;
    pLVar6[uVar4].field_0x5c = pLVar6[uVar4].field_0x5c & 0xf8;
    *(uint *)&pLVar6[uVar4].super_Node.field_0x30 = uVar5 & 0xfffff800 | 0x100;
    return pLVar6 + uVar4;
  }
  __assert_fail("m_free[m_nextFree] < m_poolSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x42,
                "T *rengine::AllocationPool<rengine::LayoutNode>::allocate() [T = rengine::LayoutNode]"
               );
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }